

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O2

bool __thiscall Boolean::Decode(Boolean *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  undefined8 *puVar2;
  size_t sStack_40;
  size_t local_38;
  size_t size;
  size_t cbPrefix;
  
  local_38 = 0;
  size = 0;
  bVar1 = CheckDecode(pIn,cbIn,Boolean,&local_38,&size);
  if (bVar1) {
    if (local_38 + size != 3) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = &std::cout;
      __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
    }
    this->b = -(pIn[2] != '\0');
    sStack_40 = 3;
  }
  else {
    if (((cbIn < 2) || (*pIn != '\x05')) || (pIn[1] != '\0')) {
      sStack_40 = 0;
      bVar1 = false;
      goto LAB_0012bc5b;
    }
    sStack_40 = 2;
  }
  bVar1 = true;
LAB_0012bc5b:
  *cbUsed = sStack_40;
  return bVar1;
}

Assistant:

bool Boolean::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
	size_t size = 0;
	size_t cbPrefix = 0;
	if (!CheckDecode(pIn, cbIn, DerType::Boolean, size, cbPrefix))
	{
		return DecodeNull(pIn, cbIn, cbUsed);
	}

	// Now check specifics for this type
	if (cbPrefix + size != 3)
		throw std::exception(); // Incorrect decode

	b = pIn[2] ? 0xff : 0;
	cbUsed = 3;
	return true;
}